

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommychain.h
# Opt level: O0

void tommy_chain_merge(tommy_chain *first,tommy_chain *second,undefined1 *cmp)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  tommy_node *next;
  tommy_node *second_i;
  tommy_node *first_i;
  undefined1 *cmp_local;
  tommy_chain *second_local;
  tommy_chain *first_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  second_i = first->head;
  next = second->head;
  do {
    while (iVar3 = (*(code *)cmp)(second_i->data,next->data), iVar3 < 1) {
      if (second_i == first->tail) {
        tommy_chain_concat(second_i,next);
        first->tail = second->tail;
        goto LAB_00119554;
      }
      second_i = second_i->next;
    }
    ptVar2 = next->next;
    if (second_i == first->head) {
      tommy_chain_concat(next,second_i);
      first->head = next;
    }
    else {
      tommy_chain_splice(second_i->prev,second_i,next,next);
    }
    bVar4 = next != second->tail;
    next = ptVar2;
  } while (bVar4);
LAB_00119554:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void tommy_chain_merge(tommy_chain* first, tommy_chain* second, tommy_compare_func* cmp)
{
	tommy_node* first_i = first->head;
	tommy_node* second_i = second->head;

	/* merge */
	while (1) {
		if (cmp(first_i->data, second_i->data) > 0) {
			tommy_node* next = second_i->next;
			if (first_i == first->head) {
				tommy_chain_concat(second_i, first_i);
				first->head = second_i;
			} else {
				tommy_chain_splice(first_i->prev, first_i, second_i, second_i);
			}
			if (second_i == second->tail)
				break;
			second_i = next;
		} else {
			if (first_i == first->tail) {
				tommy_chain_concat(first_i, second_i);
				first->tail = second->tail;
				break;
			}
			first_i = first_i->next;
		}
	}
}